

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

void mtrap_menu_browser(wchar_t oid,void *data,region *loc)

{
  text_out_hook = text_out_to_screen;
  text_out_wrap = L'<';
  text_out_indent = loc->col + L'\xffffffff';
  text_out_pad = L'\x01';
  clear_from(loc->page_rows + loc->row);
  Term_gotoxy(loc->col,loc->row + loc->page_rows + L'\x01');
  text_out_to_screen('\x1b',*(char **)((long)data + (long)oid * 0x88 + 8));
  text_out_pad = L'\0';
  text_out_indent = L'\0';
  text_out_wrap = L'\0';
  return;
}

Assistant:

static void mtrap_menu_browser(int oid, void *data, const region *loc)
{
	struct trap_kind *d = data;

	/* Redirect output to the screen */
	text_out_hook = text_out_to_screen;
	text_out_wrap = 60;
	text_out_indent = loc->col - 1;
	text_out_pad = 1;


	clear_from(loc->row + loc->page_rows);
	Term_gotoxy(loc->col, loc->row + loc->page_rows + 1);
	text_out_to_screen(COLOUR_DEEP_L_BLUE, d[oid].text);

	/* Reset */
	text_out_pad = 0;
	text_out_indent = 0;
	text_out_wrap = 0;
}